

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O1

void __thiscall
duckdb::PartitionedTupleData::BuildBufferSpace
          (PartitionedTupleData *this,PartitionedTupleDataAppendState *state)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->_vptr_PartitionedTupleData[5])();
  if (CONCAT44(extraout_var,iVar1) < 0x100) {
    BuildBufferSpace<true>(this,state);
    return;
  }
  BuildBufferSpace<false>(this,state);
  return;
}

Assistant:

void PartitionedTupleData::BuildBufferSpace(PartitionedTupleDataAppendState &state) {
	if (UseFixedSizeMap()) {
		BuildBufferSpace<true>(state);
	} else {
		BuildBufferSpace<false>(state);
	}
}